

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_bundle.cpp
# Opt level: O3

fe_node * fe_load_node(fe_state *s)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  fe_node_fill *__dest;
  int i;
  ulong uVar4;
  long lVar5;
  fe_grad *pfVar6;
  float fVar7;
  int a;
  fe_node nd;
  uchar local_c4 [4];
  fe_node local_c0;
  
  read_token(s);
  if (s->error == true) {
LAB_0010ff20:
    __assert_fail("!\"fe parse error\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/frankinshtein[P]font-effects-lib/src/fe_bundle.cpp"
                  ,0x2c,"void error()");
  }
  pcVar1 = s->token;
  if (*pcVar1 != '*') {
    s->error = true;
    s->token = pcVar1 + 1;
    goto LAB_0010ff20;
  }
  s->token = pcVar1 + 1;
  if (s->error != false) goto LAB_0010ff20;
  fe_node_init(&local_c0,0,(get_node_image)0x0);
  local_c0.type = atoi(s->token);
  read_token(s);
  local_c0.id = atoi(s->token);
  if (s->error == true) goto LAB_0010ff20;
  read_token(s);
  local_c0.flags = atoi(s->token);
  if (s->error == true) goto LAB_0010ff20;
  read_token(s);
  local_c0.x = atoi(s->token);
  if (s->error == true) goto LAB_0010ff20;
  read_token(s);
  local_c0.y = atoi(s->token);
  if (s->error == true) goto LAB_0010ff20;
  read_token(s);
  local_c0.vis_x = atoi(s->token);
  if (s->error == true) goto LAB_0010ff20;
  read_token(s);
  local_c0.vis_y = atoi(s->token);
  if (s->error != false) goto LAB_0010ff20;
  lVar5 = 0x12;
  do {
    fVar7 = read_float(s);
    (&((fe_node *)(local_c0.in + -4))->id)[lVar5] = (int)fVar7;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x16);
  if (s->error != false) goto LAB_0010ff20;
  lVar5 = 0x16;
  do {
    read_token(s);
    iVar2 = atoi(s->token);
    (&((fe_node *)(local_c0.in + -4))->id)[lVar5] = iVar2;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1a);
  if ((s->error != false) || (read_token(s), s->error == true)) goto LAB_0010ff20;
  pcVar1 = s->token;
  lVar5 = 0;
  do {
    local_c0.name[lVar5] = pcVar1[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x10);
  if (local_c0.type < 3) {
    if (local_c0.type == 1) {
      __dest = (fe_node_fill *)fe_node_image_alloc();
      goto LAB_0010fee7;
    }
    if (local_c0.type == 2) {
      __dest = (fe_node_fill *)fe_node_image_fixed_alloc();
      goto LAB_0010fee7;
    }
  }
  else {
    if (local_c0.type == 3) {
      __dest = fe_node_fill_alloc();
      s->data = s->data + 1;
      s->size = s->size + -1;
      read_token(s);
      uVar3 = atoi(s->token);
      if (s->error != true) {
        (__dest->grad).colors_num = uVar3;
        if (0 < (int)uVar3) {
          pfVar6 = &__dest->grad;
          uVar4 = (ulong)uVar3;
          do {
            read_token(s);
            if (s->error == true) goto LAB_0010ff20;
            parse_color(s->token,pfVar6->colors);
            fVar7 = read_float(s);
            pfVar6->colors_pos[0] = fVar7;
            if (s->error == true) goto LAB_0010ff20;
            pfVar6 = (fe_grad *)(pfVar6->colors + 1);
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        read_token(s);
        uVar3 = atoi(s->token);
        if (s->error == false) {
          (__dest->grad).alpha_num = uVar3;
          if (0 < (int)uVar3) {
            uVar4 = 0;
            do {
              read_token(s);
              if (s->error == true) goto LAB_0010ff20;
              __isoc99_sscanf(s->token,"%02x",local_c4);
              (__dest->grad).alpha[uVar4] = local_c4[0];
              fVar7 = read_float(s);
              (__dest->grad).alpha_pos[uVar4] = fVar7;
              if (s->error == true) goto LAB_0010ff20;
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          fVar7 = read_float(s);
          (__dest->plane).a = fVar7;
          if (s->error == false) {
            fVar7 = read_float(s);
            (__dest->plane).b = fVar7;
            if (s->error != true) {
              fVar7 = read_float(s);
              (__dest->plane).d = fVar7;
              if (s->error != true) {
                fVar7 = read_float(s);
                (__dest->plane).scale = fVar7;
                if (s->error != true) goto LAB_0010fee7;
              }
            }
          }
        }
      }
      goto LAB_0010ff20;
    }
    if (local_c0.type == 0xc) {
      __dest = (fe_node_fill *)fe_node_fill_radial_alloc();
      s->data = s->data + 1;
      s->size = s->size + -1;
      read_token(s);
      uVar3 = atoi(s->token);
      if (s->error != true) {
        (__dest->grad).colors_num = uVar3;
        if (0 < (int)uVar3) {
          pfVar6 = &__dest->grad;
          uVar4 = (ulong)uVar3;
          do {
            read_token(s);
            if (s->error == true) goto LAB_0010ff20;
            parse_color(s->token,pfVar6->colors);
            fVar7 = read_float(s);
            pfVar6->colors_pos[0] = fVar7;
            if (s->error == true) goto LAB_0010ff20;
            pfVar6 = (fe_grad *)(pfVar6->colors + 1);
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
        read_token(s);
        uVar3 = atoi(s->token);
        if (s->error == false) {
          (__dest->grad).alpha_num = uVar3;
          if (0 < (int)uVar3) {
            uVar4 = 0;
            do {
              read_token(s);
              if (s->error == true) goto LAB_0010ff20;
              __isoc99_sscanf(s->token,"%02x",local_c4);
              (__dest->grad).alpha[uVar4] = local_c4[0];
              fVar7 = read_float(s);
              (__dest->grad).alpha_pos[uVar4] = fVar7;
              if (s->error == true) goto LAB_0010ff20;
              uVar4 = uVar4 + 1;
            } while (uVar3 != uVar4);
          }
          goto LAB_0010fee7;
        }
      }
      goto LAB_0010ff20;
    }
  }
  __dest = (fe_node_fill *)fe_node_alloc(local_c0.type);
LAB_0010fee7:
  local_c0.get_image = (__dest->base).get_image;
  memcpy(__dest,&local_c0,0x90);
  return &__dest->base;
}

Assistant:

fe_node* fe_load_node(fe_state& s)
{
    read_token(s);
    CHECK_ERR();

    if (*s.token != '*')
        s.error = 1;
    s.token++;//skip *
    CHECK_ERR();

    fe_node nd;   
    fe_node_init(&nd, 0, 0);

    nd.type = atoi(s.token);
    nd.id = READ_INT(s);
    nd.flags = READ_INT(s);
    nd.x = READ_INT(s);
    nd.y = READ_INT(s);
    nd.vis_x = READ_INT(s);
    nd.vis_y = READ_INT(s);
    

    for (int i = 0; i < FE_MAX_PROPS; ++i)
        nd.properties_float[i] = READ_FLOAT(s);
    for (int i = 0; i < FE_MAX_PROPS; ++i)
        nd.properties_int[i] = READ_INT(s);
    
    read_token(s);
    CHECK_ERR();

    safe_strcpy(nd.name, s.token);


    fe_node* node = 0;
    switch (nd.type)
    {
        case fe_node_type_source_image:
            node = &fe_node_image_alloc()->base;
            break;

        case fe_node_type_image_fixed:
            node = &fe_node_image_fixed_alloc()->base;
            break;

        case fe_node_type_fill:
        {
            fe_node_fill* nf = fe_node_fill_alloc();

            node = &nf->base;

            s.data++;
            s.size--;
            fe_grad* grad = &nf->grad;

            //read colors
            int colors = READ_INT(s);
            grad->colors_num = colors;
            for (int i = 0; i < colors; ++i)
            {
                read_token(s);
                CHECK_ERR();

                fe_color* c = &grad->colors[i];

                parse_color(s.token, c);

                grad->colors_pos[i] = READ_FLOAT(s);
            }

            //read alpha
            int alpha_num = READ_INT(s);
            grad->alpha_num = alpha_num;
            for (int i = 0; i < alpha_num; ++i)
            {
                read_token(s);
                CHECK_ERR();

                unsigned char* c = &grad->alpha[i];

                parse_alpha(s.token, c);

                grad->alpha_pos[i] = READ_FLOAT(s);
            }

            fe_plane &plane = nf->plane;
            plane.a = READ_FLOAT(s);
            plane.b = READ_FLOAT(s);
            plane.d = READ_FLOAT(s);
            plane.scale = READ_FLOAT(s);

        } break;

        case fe_node_type_fill_radial:
        {
            fe_node_fill_radial* nf = fe_node_fill_radial_alloc();

            node = &nf->base;

            s.data++;
            s.size--;
            fe_grad* grad = &nf->grad;

            //read colors
            int colors = READ_INT(s);
            grad->colors_num = colors;
            for (int i = 0; i < colors; ++i)
            {
                read_token(s);
                CHECK_ERR();

                fe_color* c = &grad->colors[i];

                parse_color(s.token, c);

                grad->colors_pos[i] = READ_FLOAT(s);
            }

            //read alpha
            int alpha_num = READ_INT(s);
            grad->alpha_num = alpha_num;
            for (int i = 0; i < alpha_num; ++i)
            {
                read_token(s);
                CHECK_ERR();

                unsigned char* c = &grad->alpha[i];

                parse_alpha(s.token, c);

                grad->alpha_pos[i] = READ_FLOAT(s);
            }

        } break;

        default:
        {
            node = fe_node_alloc(nd.type);
            break;
        }
    }
        
    nd.get_image = node->get_image;
    memcpy(node, &nd, sizeof(nd));

    return node;
}